

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

cargo_type_t cargo_get_option_type(cargo_t ctx,char *opt)

{
  int iVar1;
  size_t local_30;
  size_t opt_i;
  cargo_opt_t *o;
  char *opt_local;
  cargo_t ctx_local;
  
  opt_i = 0;
  o = (cargo_opt_t *)opt;
  opt_local = (char *)ctx;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1bc3,"cargo_type_t cargo_get_option_type(cargo_t, const char *)");
  }
  if (opt != (char *)0x0) {
    iVar1 = _cargo_find_option_name(ctx,opt,&local_30,(size_t *)0x0);
    if (iVar1 == 0) {
      ctx_local._4_4_ = *(cargo_type_t *)(*(long *)(opt_local + 0x80) + local_30 * 0x128 + 0x3c);
    }
    else {
      ctx_local._4_4_ = 0xffffffff;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("opt",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1bc4,"cargo_type_t cargo_get_option_type(cargo_t, const char *)");
}

Assistant:

cargo_type_t cargo_get_option_type(cargo_t ctx, const char *opt)
{
    cargo_opt_t *o = NULL;
    size_t opt_i;
    assert(ctx);
    assert(opt);

    if (_cargo_find_option_name(ctx, opt, &opt_i, NULL))
    {
        CARGODBG(1, "No such option \"%s\"\n", opt);
        return -1;
    }

    o = &ctx->options[opt_i];

    return o->type;
}